

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O3

void __thiscall duckdb::MetadataBlock::FreeBlocksFromInteger(MetadataBlock *this,idx_t free_list)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  idx_t index;
  ulong uVar3;
  bool bVar4;
  uchar local_29;
  
  puVar2 = (this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (free_list != 0) {
    uVar3 = 0x3f;
    do {
      if ((free_list >> (uVar3 & 0x3f) & 1) != 0) {
        local_29 = (uchar)uVar3;
        __position._M_current =
             (this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&(this->free_blocks).
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__position,
                     &local_29);
        }
        else {
          *__position._M_current = local_29;
          ppuVar1 = &(this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                     .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
      }
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void MetadataBlock::FreeBlocksFromInteger(idx_t free_list) {
	free_blocks.clear();
	if (free_list == 0) {
		return;
	}
	for (idx_t i = 64; i > 0; i--) {
		auto index = i - 1;
		idx_t mask = idx_t(1) << index;
		if (free_list & mask) {
			free_blocks.push_back(UnsafeNumericCast<uint8_t>(index));
		}
	}
}